

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

LogMessage * __thiscall
absl::lts_20250127::log_internal::LogMessage::AtLocation(LogMessage *this,string_view file,int line)

{
  pointer pLVar1;
  char *extraout_RDX;
  string_view sVar2;
  size_t local_38;
  char *local_30;
  int line_local;
  LogMessage *this_local;
  string_view file_local;
  
  pLVar1 = std::
           unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  (pLVar1->entry).full_filename_._M_len = file._M_len;
  (pLVar1->entry).full_filename_._M_str = file._M_str;
  sVar2._M_str = extraout_RDX;
  sVar2._M_len = (size_t)file._M_str;
  sVar2 = anon_unknown_4::Basename((anon_unknown_4 *)file._M_len,sVar2);
  pLVar1 = std::
           unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  local_38 = sVar2._M_len;
  (pLVar1->entry).base_filename_._M_len = local_38;
  local_30 = sVar2._M_str;
  (pLVar1->entry).base_filename_._M_str = local_30;
  pLVar1 = std::
           unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  (pLVar1->entry).line_ = line;
  LogBacktraceIfNeeded(this);
  return this;
}

Assistant:

LogMessage& LogMessage::AtLocation(absl::string_view file, int line) {
  data_->entry.full_filename_ = file;
  data_->entry.base_filename_ = Basename(file);
  data_->entry.line_ = line;
  LogBacktraceIfNeeded();
  return *this;
}